

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotDiff.cpp
# Opt level: O0

void __thiscall OpenMD::PotDiff::PotDiff(PotDiff *this,SimInfo *info,string *filename,string *sele)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  SelectionEvaluator *this_00;
  AtomType *AT;
  SnapshotManager *pSVar4;
  string *in_RCX;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  FluctuatingChargeAdapter fqa;
  AtomType *at;
  int cutoffGroupStorageLayout;
  int rigidBodyStorageLayout;
  int atomStorageLayout;
  SimInfo *in_stack_00000138;
  int i;
  StuntDouble *sd;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  StaticAnalyser *in_stack_fffffffffffffe90;
  SimInfo *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  uint uVar5;
  SelectionEvaluator *this_01;
  undefined8 *puVar6;
  bool __x;
  vector<bool,_std::allocator<bool>_> *this_02;
  SimInfo *info_00;
  SimSnapshotManager *this_03;
  SnapshotManager *in_stack_ffffffffffffff18;
  SimInfo *in_stack_ffffffffffffff20;
  FluctuatingChargeAdapter local_b8;
  RealType in_stack_ffffffffffffff58;
  RealType in_stack_ffffffffffffff60;
  RealType in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint local_84;
  string local_80 [8];
  SimInfo *in_stack_ffffffffffffff88;
  SelectionEvaluator *in_stack_ffffffffffffff90;
  string local_60 [40];
  SimInfo *local_38;
  string *local_20;
  SimInfo *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98,(string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c
            );
  *in_RDI = &PTR__PotDiff_0055fcd8;
  info_00 = (SimInfo *)(in_RDI + 0x1a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x19a9f4);
  this_03 = (SimSnapshotManager *)(in_RDI + 0x1d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x19aa0d);
  Utils::Accumulator<double>::Accumulator((Accumulator<double> *)(in_RDI + 0x20));
  std::__cxx11::string::string((string *)(in_RDI + 0x27),local_20);
  this_02 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x2b);
  SelectionManager::SelectionManager((SelectionManager *)sd,in_stack_00000138);
  puVar6 = in_RDI + 0x44;
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_01 = (SelectionEvaluator *)(in_RDI + 0xee);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x19aaa6);
  getPrefix((string *)in_stack_fffffffffffffe98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffe90,
             (string *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  local_84 = SimInfo::getAtomStorageLayout((SimInfo *)in_RDI[1]);
  uVar5 = local_84;
  iVar2 = SimInfo::getRigidBodyStorageLayout(local_10);
  iVar3 = SimInfo::getCutoffGroupStorageLayout(local_10);
  local_84 = local_84 | 0x1c000;
  SimInfo::setAtomStorageLayout((SimInfo *)in_RDI[1],local_84);
  this_00 = (SelectionEvaluator *)operator_new(0x30);
  SimSnapshotManager::SimSnapshotManager
            (this_03,info_00,(int)((ulong)this_02 >> 0x20),(int)this_02,(int)((ulong)puVar6 >> 0x20)
            );
  SimInfo::setSnapshotManager(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SelectionEvaluator::loadScriptString(this_01,(string *)CONCAT44(uVar5,iVar2));
  SelectionEvaluator::evaluate(this_00);
  SelectionManager::setSelectionSet
            ((SelectionManager *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (SelectionSet *)in_stack_fffffffffffffe98);
  SelectionSet::~SelectionSet((SelectionSet *)0x19ac83);
  local_38 = (SimInfo *)
             SelectionManager::beginSelected
                       ((SelectionManager *)
                        CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                        (int *)in_stack_fffffffffffffe98);
  while (local_38 != (SimInfo *)0x0) {
    AT = Atom::getAtomType((Atom *)local_38);
    FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_b8,AT);
    uVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x19ad07);
    __x = SUB81((ulong)puVar6 >> 0x38,0);
    if ((bool)uVar1) {
      std::vector<bool,_std::allocator<bool>_>::push_back(this_02,__x);
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::push_back(this_02,__x);
      Polynomial<double>::Polynomial
                ((Polynomial<double> *)CONCAT17(uVar1,in_stack_fffffffffffffea0),
                 (double)in_stack_fffffffffffffe98);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                ((FluctuatingChargeAdapter *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (DoublePolynomial *)AT);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x19ae96);
      StuntDouble::setFlucQPos
                ((StuntDouble *)CONCAT17(uVar1,in_stack_fffffffffffffea0),
                 (RealType)in_stack_fffffffffffffe98);
    }
    in_stack_fffffffffffffe98 =
         (SimInfo *)
         SelectionManager::nextSelected
                   ((SelectionManager *)CONCAT17(uVar1,in_stack_fffffffffffffea0),
                    (int *)in_stack_fffffffffffffe98);
    local_38 = in_stack_fffffffffffffe98;
  }
  pSVar4 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
  (*pSVar4->_vptr_SnapshotManager[2])();
  return;
}

Assistant:

PotDiff::PotDiff(SimInfo* info, const std::string& filename,
                   const std::string& sele) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    StuntDouble* sd;
    int i;

    setOutputName(getPrefix(filename) + ".potDiff");

    // The PotDiff is computed by negating the charge on the atom type
    // using fluctuating charge values.  If we don't have any
    // fluctuating charges in the simulation, we need to expand
    // storage to hold them.
    int atomStorageLayout        = info_->getAtomStorageLayout();
    int rigidBodyStorageLayout   = info->getRigidBodyStorageLayout();
    int cutoffGroupStorageLayout = info->getCutoffGroupStorageLayout();

    atomStorageLayout |= DataStorage::dslFlucQPosition;
    atomStorageLayout |= DataStorage::dslFlucQVelocity;
    atomStorageLayout |= DataStorage::dslFlucQForce;

    info_->setAtomStorageLayout(atomStorageLayout);
    info_->setSnapshotManager(new SimSnapshotManager(info_, atomStorageLayout,
                                                     rigidBodyStorageLayout,
                                                     cutoffGroupStorageLayout));

    // now we have to figure out which AtomTypes to convert to fluctuating
    // charges
    evaluator_.loadScriptString(sele);
    seleMan_.setSelectionSet(evaluator_.evaluate());
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      AtomType* at                 = static_cast<Atom*>(sd)->getAtomType();
      FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(at);
      if (fqa.isFluctuatingCharge()) {
        selectionWasFlucQ_.push_back(true);
      } else {
        selectionWasFlucQ_.push_back(false);
        // make a fictitious fluctuating charge with an unphysical
        // charge mass and slaterN, but we need to zero out the
        // electronegativity and hardness to remove the self
        // contribution:
        fqa.makeFluctuatingCharge(1.0e9, 0.0, 0.0, 1);
        sd->setFlucQPos(0.0);
      }
    }
    info_->getSnapshotManager()->advance();
  }